

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest::AddFile
          (DiskSourceTreeTest *this,string *filename,char *contents)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  Status *local_88;
  LogMessage local_68;
  Voidify local_55 [13];
  string_view local_48;
  Status local_38;
  undefined1 local_30 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  char *contents_local;
  string *filename_local;
  DiskSourceTreeTest *this_local;
  
  absl_log_internal_check_ok_goo.second = contents;
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,absl_log_internal_check_ok_goo.second);
  File::SetContents((File *)&local_38,filename,local_48,true);
  local_30 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_38);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_30);
  if (bVar1) {
    local_88 = (Status *)0x0;
  }
  else {
    local_88 = (Status *)
               absl::lts_20250127::status_internal::MakeCheckFailString
                         ((Nonnull<const_absl::Status_*>)local_30,
                          "File::SetContents(filename, contents, true) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_88;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_30);
  absl::lts_20250127::Status::~Status(&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x106,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_55,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void AddFile(const std::string& filename, const char* contents) {
    ABSL_CHECK_OK(File::SetContents(filename, contents, true));
  }